

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O0

void __thiscall chatra::Reference::setWithoutBothLock(Reference *this,Reference *ref)

{
  Reference *ref_local;
  Reference *this_local;
  
  switch(ref->node->type) {
  case Bool:
    ReferenceNode::setBool(this->node,(bool)((ref->node->field_3).vBool & 1));
    break;
  case Int:
    ReferenceNode::setInt(this->node,(ref->node->field_3).vInt);
    break;
  case Float:
    ReferenceNode::setFloat(this->node,(ref->node->field_3).vFloat);
    break;
  case Object:
    ReferenceNode::setObject(this->node,ref->node->object);
  }
  return;
}

Assistant:

void setWithoutBothLock(const Reference& ref) const {
		chatra_assert(node != nullptr && ref.node != nullptr);
		switch (ref.node->type) {
		case ReferenceValueType::Bool:  node->setBool(ref.node->vBool); break;
		case ReferenceValueType::Int:  node->setInt(ref.node->vInt); break;
		case ReferenceValueType::Float:  node->setFloat(ref.node->vFloat); break;
		case ReferenceValueType::Object:  node->setObject(ref.node->object); break;
		}
	}